

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

void __thiscall
wabt::FileStream::FileStream(FileStream *this,string_view filename,Stream *log_stream)

{
  FILE *__stream;
  FILE *pFVar1;
  uint *puVar2;
  string filename_str;
  allocator<char> local_41;
  char *local_40 [4];
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = filename._M_str;
  local_20._M_len = filename._M_len;
  (this->super_Stream).offset_ = 0;
  (this->super_Stream).result_.enum_ = Ok;
  (this->super_Stream).log_stream_ = log_stream;
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__FileStream_001d5200;
  this->file_ = (FILE *)0x0;
  this->offset_ = 0;
  this->should_close_ = false;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_40,&local_20,&local_41);
  pFVar1 = fopen(local_40[0],"wb");
  this->file_ = (FILE *)pFVar1;
  __stream = _stderr;
  if (pFVar1 == (FILE *)0x0) {
    puVar2 = (uint *)__errno_location();
    fprintf(__stream,"%s:%d: fopen name=\"%s\" failed, errno=%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/stream.cc"
            ,0xf1,local_40[0],(ulong)*puVar2);
  }
  else {
    this->should_close_ = true;
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

FileStream::FileStream(std::string_view filename, Stream* log_stream)
    : Stream(log_stream), file_(nullptr), offset_(0), should_close_(false) {
  std::string filename_str(filename);
  file_ = fopen(filename_str.c_str(), "wb");

  // TODO(binji): this is pretty cheesy, should come up with a better API.
  if (file_) {
    should_close_ = true;
  } else {
    ERROR("fopen name=\"%s\" failed, errno=%d\n", filename_str.c_str(), errno);
  }
}